

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcMaterialDefinitionRepresentation::IfcMaterialDefinitionRepresentation
          (IfcMaterialDefinitionRepresentation *this)

{
  *(undefined ***)&this->field_0x90 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x98 = 0;
  *(char **)&this->field_0xa0 = "IfcMaterialDefinitionRepresentation";
  IfcProductRepresentation::IfcProductRepresentation
            (&this->super_IfcProductRepresentation,&PTR_construction_vtable_24__007b0c20);
  *(undefined8 *)&(this->super_IfcProductRepresentation).field_0x80 = 0;
  *(undefined8 *)&(this->super_IfcProductRepresentation).field_0x88 = 0;
  (this->super_IfcProductRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x7b0bb8;
  *(undefined8 *)&this->field_0x90 = 0x7b0c08;
  *(undefined8 *)&(this->super_IfcProductRepresentation).field_0x78 = 0x7b0be0;
  return;
}

Assistant:

IfcMaterialDefinitionRepresentation() : Object("IfcMaterialDefinitionRepresentation") {}